

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSet.cpp
# Opt level: O0

void __thiscall myvk::DescriptorSet::~DescriptorSet(DescriptorSet *this)

{
  PFN_vkFreeDescriptorSets p_Var1;
  element_type *peVar2;
  element_type *this_00;
  VkDevice pVVar3;
  VkDescriptorPool pVVar4;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__DescriptorSet_00530dc8;
  p_Var1 = vkFreeDescriptorSets;
  if (in_RDI[7] != 0) {
    peVar2 = std::
             __shared_ptr_access<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e5f69);
    (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    this_00 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2e5f86);
    pVVar3 = Device::GetHandle(this_00);
    peVar2 = std::
             __shared_ptr_access<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e5fa3);
    pVVar4 = DescriptorPool::GetHandle(peVar2);
    (*p_Var1)(pVVar3,pVVar4,1,(VkDescriptorSet *)(in_RDI + 7));
  }
  std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)0x2e5fe3);
  std::shared_ptr<myvk::DescriptorPool>::~shared_ptr((shared_ptr<myvk::DescriptorPool> *)0x2e5ff1);
  DeviceObjectBase::~DeviceObjectBase((DeviceObjectBase *)0x2e5ffb);
  return;
}

Assistant:

DescriptorSet::~DescriptorSet() {
	if (m_descriptor_set)
		vkFreeDescriptorSets(m_descriptor_pool_ptr->GetDevicePtr()->GetHandle(), m_descriptor_pool_ptr->GetHandle(), 1,
		                     &m_descriptor_set);
}